

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::iterate(FunctionalTest7_8 *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  socklen_t __len;
  sockaddr *__addr;
  uint local_a4;
  uint local_a0;
  GLuint i_1;
  GLuint i;
  GLuint uniform;
  GLuint routine;
  bool result;
  vertexArray vao;
  buffer transform_feedback_buffer;
  program program;
  string local_40;
  FunctionalTest7_8 *local_10;
  FunctionalTest7_8 *this_local;
  
  local_10 = this;
  if (iterate()::uni_left == '\0') {
    iVar3 = __cxa_guard_acquire(&iterate()::uni_left);
    if (iVar3 != 0) {
      Utils::vec4<float>::vec4(&iterate::uni_left,-1.0,0.75,-0.5,0.25);
      __cxa_guard_release(&iterate()::uni_left);
    }
  }
  if (iterate()::uni_right == '\0') {
    iVar3 = __cxa_guard_acquire(&iterate()::uni_right);
    if (iVar3 != 0) {
      Utils::vec4<float>::vec4(&iterate::uni_right,1.0,-0.75,0.5,-0.25);
      __cxa_guard_release(&iterate()::uni_right);
    }
  }
  if (iterate()::uni_indices == '\0') {
    iVar3 = __cxa_guard_acquire(&iterate()::uni_indices);
    if (iVar3 != 0) {
      Utils::vec4<unsigned_int>::vec4(&iterate::uni_indices,1,2,0,3);
      __cxa_guard_release(&iterate()::uni_indices);
    }
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    program.m_context._6_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)((long)&program.m_context + 7));
    tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
    program.m_context._6_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  Utils::program::program
            ((program *)&transform_feedback_buffer.m_context,(this->super_TestCase).m_context);
  Utils::buffer::buffer((buffer *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&routine,(this->super_TestCase).m_context);
  bVar1 = true;
  iVar3 = 0;
  __len = 0;
  Utils::program::build
            ((program *)&transform_feedback_buffer.m_context,(GLchar *)0x0,(GLchar *)0x0,
             (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
             iterate::varying_names,8,false);
  Utils::program::use((program *)&transform_feedback_buffer.m_context);
  Utils::vertexArray::generate((vertexArray *)&routine);
  Utils::vertexArray::bind((vertexArray *)&routine,iVar3,__addr,__len);
  Utils::buffer::generate((buffer *)&vao.m_context);
  for (i = 0; i < 2; i = i + 1) {
    GVar4 = Utils::program::getSubroutineIndex
                      ((program *)&transform_feedback_buffer.m_context,iterate::subroutine_names[i],
                       0x8b31);
    this->m_subroutine_indices[i] = GVar4;
  }
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    GVar4 = Utils::program::getSubroutineUniformLocation
                      ((program *)&transform_feedback_buffer.m_context,
                       iterate::subroutine_uniform_names[i_1],0x8b31);
    this->m_subroutine_uniform_locations[i_1] = GVar4;
  }
  for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
    GVar4 = Utils::program::getUniformLocation
                      ((program *)&transform_feedback_buffer.m_context,
                       iterate::uniform_names[local_a0]);
    this->m_uniform_locations[local_a0] = GVar4;
  }
  for (local_a4 = 0; local_a4 < 0x10; local_a4 = local_a4 + 1) {
    Utils::buffer::update((buffer *)&vao.m_context,0x8c8e,0x80,(GLvoid *)0x0,0x88ea);
    Utils::buffer::bindRange((buffer *)&vao.m_context,0x8c8e,0,0,0x80);
    bVar2 = testDraw(this,iterate::subroutine_combinations[local_a4],&iterate::uni_left,
                     &iterate::uni_right,&iterate::uni_indices);
    if (!bVar2) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&routine);
  Utils::buffer::~buffer((buffer *)&vao.m_context);
  Utils::program::~program((program *)&transform_feedback_buffer.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest7_8::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definitions\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine[4];\n"
		"\n"
		"// Input data\n"
		"uniform vec4  uni_left;\n"
		"uniform vec4  uni_right;\n"
		"uniform uvec4 uni_indices;\n"
		"\n"
		"// Output\n"
		"out vec4 out_combined;\n"
		"out vec4 out_combined_inverted;\n"
		"out vec4 out_constant;\n"
		"out vec4 out_constant_inverted;\n"
		"out vec4 out_dynamic;\n"
		"out vec4 out_dynamic_inverted;\n"
		"out vec4 out_loop;\n"
		"out uint out_array_length;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_combined          = routine[3](routine[2](routine[1](routine[0](uni_left, uni_right), uni_right), "
		"uni_right), uni_right);\n"
		"    out_combined_inverted = routine[0](routine[1](routine[2](routine[3](uni_left, uni_right), uni_right), "
		"uni_right), uni_right);\n"
		"    \n"
		"    out_constant          = routine[3](routine[2](routine[1](routine[0](vec4(1, 2, 3, 4), vec4(-5, -6, -7, "
		"-8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n"
		"    out_constant_inverted = routine[0](routine[1](routine[2](routine[3](vec4(1, 2, 3, 4), vec4(-5, -6, -7, "
		"-8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n"
		"    \n"
		"    out_dynamic           = "
		"routine[uni_indices.w](routine[uni_indices.z](routine[uni_indices.y](routine[uni_indices.x](uni_left, "
		"uni_right), uni_right), uni_right), uni_right);\n"
		"    out_dynamic_inverted  = "
		"routine[uni_indices.x](routine[uni_indices.y](routine[uni_indices.z](routine[uni_indices.w](uni_left, "
		"uni_right), uni_right), uni_right), uni_right);\n"
		"    \n"
		"    out_loop              = uni_left;\n"
		"    for (uint i = 0u; i < routine.length(); ++i)\n"
		"    {\n"
		"        out_loop          = routine[i](out_loop, uni_right);\n"
		"    }\n"
		"    \n"
		"    out_array_length      = routine.length() + 6 - (uni_indices.x + uni_indices.y + uni_indices.z + "
		"uni_indices.w);\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[] = {
		"add", "multiply",
	};
	static const GLuint n_subroutine_names = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "routine[0]", "routine[1]", "routine[2]", "routine[3]" };
	static const GLuint  n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_names[] = {
		"uni_left", "uni_right", "uni_indices",
	};
	static const GLuint n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	static const GLchar* varying_names[] = { "out_combined", "out_combined_inverted",
											 "out_constant", "out_constant_inverted",
											 "out_dynamic",  "out_dynamic_inverted",
											 "out_loop",	 "out_array_length" };

	static const GLuint n_varyings					   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varyings * 4 * sizeof(GLfloat);

	/* Test data */
	static const Utils::vec4<GLfloat> uni_left(-1.0f, 0.75f, -0.5f, 0.25f);
	static const Utils::vec4<GLfloat> uni_right(1.0f, -0.75f, 0.5f, -0.25f);
	static const Utils::vec4<GLuint>  uni_indices(1, 2, 0, 3);

	static const GLuint subroutine_combinations[][4] = {
		{ 0, 0, 0, 0 }, /* + + + + */
		{ 0, 0, 0, 1 }, /* + + + * */
		{ 0, 0, 1, 0 }, /* + + * + */
		{ 0, 0, 1, 1 }, /* + + * * */
		{ 0, 1, 0, 0 }, /* + * + + */
		{ 0, 1, 0, 1 }, /* + * + * */
		{ 0, 1, 1, 0 }, /* + * * + */
		{ 0, 1, 1, 1 }, /* + * * * */
		{ 1, 0, 0, 0 }, /* * + + + */
		{ 1, 0, 0, 1 }, /* * + + * */
		{ 1, 0, 1, 0 }, /* * + * + */
		{ 1, 0, 1, 1 }, /* * + * * */
		{ 1, 1, 0, 0 }, /* * * + + */
		{ 1, 1, 0, 1 }, /* * * + * */
		{ 1, 1, 1, 0 }, /* * * * + */
		{ 1, 1, 1, 1 }  /* * * * * */
	};
	static const GLuint n_subroutine_combinations =
		sizeof(subroutine_combinations) / sizeof(subroutine_combinations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool result = true;

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, varying_names,
				  n_varyings);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();

	/* Get subroutine indices */
	for (GLuint routine = 0; routine < n_subroutine_names; ++routine)
	{
		m_subroutine_indices[routine] = program.getSubroutineIndex(subroutine_names[routine], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Test */
	for (GLuint i = 0; i < n_subroutine_combinations; ++i)
	{
		/* Clean */
		transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
										 GL_DYNAMIC_COPY);
		transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

		/* Verify */
		if (false == testDraw(subroutine_combinations[i], uni_left, uni_right, uni_indices))
		{
			result = false;
		}
	}

	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}